

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

void HandleError(Status *status)

{
  long lVar1;
  dbwrapper_error *this;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *fmt;
  _Alloc_hider in_stack_ffffffffffffffa8;
  string errmsg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (status->state_ == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    leveldb::Status::ToString_abi_cxx11_((string *)&stack0xffffffffffffffa8,status);
    std::operator+(&errmsg,"Fatal LevelDB error: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffa8);
    fmt = (char *)0x6c20f0;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file._M_len = 0x56;
    logging_function._M_str = "HandleError";
    logging_function._M_len = 0xb;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x31,
               IPC|I2P|VALIDATION|COINDB|LIBEVENT|PRUNE|ADDRMAN|WALLETDB|ZMQ|HTTP|TOR|NET,
               (Level)&errmsg,fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa8._M_p);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_00._M_len = 0x56;
    logging_function_00._M_str = "HandleError";
    logging_function_00._M_len = 0xb;
    LogPrintf_<>(logging_function_00,source_file_00,0x32,ALL,Info,
                 "You can use -debug=leveldb to get more complete diagnostic messages\n");
    this = (dbwrapper_error *)__cxa_allocate_exception(0x10);
    dbwrapper_error::dbwrapper_error(this,&errmsg);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&dbwrapper_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void HandleError(const leveldb::Status& status)
{
    if (status.ok())
        return;
    const std::string errmsg = "Fatal LevelDB error: " + status.ToString();
    LogPrintf("%s\n", errmsg);
    LogPrintf("You can use -debug=leveldb to get more complete diagnostic messages\n");
    throw dbwrapper_error(errmsg);
}